

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

Int32 Diligent::GetShaderTypePipelineIndex(SHADER_TYPE ShaderType,PIPELINE_TYPE PipelineType)

{
  bool bVar1;
  char (*in_R8) [37];
  char **in_R9;
  string msg;
  SHADER_TYPE local_44;
  string local_40;
  char *local_20;
  Char *local_18;
  
  local_44 = ShaderType;
  bVar1 = IsConsistentShaderType(ShaderType,PipelineType);
  if (!bVar1) {
    local_18 = GetShaderTypeLiteralName(local_44);
    local_20 = GetPipelineTypeString(PipelineType);
    in_R8 = (char (*) [37])&local_20;
    FormatString<char[13],char_const*,char[37],char_const*>
              (&local_40,(Diligent *)"Shader type ",(char (*) [13])&local_18,
               (char **)" is inconsistent with pipeline type ",in_R8,in_R9);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"GetShaderTypePipelineIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x898);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_44 & local_44 - SHADER_TYPE_VERTEX) != SHADER_TYPE_UNKNOWN) {
    FormatString<char[39]>(&local_40,(char (*) [39])"More than one shader type is specified");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"GetShaderTypePipelineIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x899);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((int)local_44 < 0x80) {
    if ((int)local_44 < 0x10) {
      switch(local_44) {
      case SHADER_TYPE_UNKNOWN:
        return -1;
      case SHADER_TYPE_VERTEX:
        return 0;
      case SHADER_TYPE_PIXEL:
        return 4;
      case SHADER_TYPE_GEOMETRY:
        return 3;
      case SHADER_TYPE_HULL:
        return 1;
      }
    }
    else {
      if (local_44 == SHADER_TYPE_DOMAIN) {
        return 2;
      }
      if (local_44 == SHADER_TYPE_COMPUTE) {
        return 0;
      }
      if (local_44 == SHADER_TYPE_AMPLIFICATION) {
        return 0;
      }
    }
  }
  else if ((int)local_44 < 0x800) {
    if ((int)local_44 < 0x200) {
      if (local_44 == SHADER_TYPE_MESH) {
        return 1;
      }
      if (local_44 == SHADER_TYPE_RAY_GEN) {
        return 0;
      }
    }
    else {
      if (local_44 == SHADER_TYPE_RAY_MISS) {
        return 1;
      }
      if (local_44 == SHADER_TYPE_RAY_CLOSEST_HIT) {
        return 2;
      }
    }
  }
  else if ((int)local_44 < 0x2000) {
    if (local_44 == SHADER_TYPE_RAY_ANY_HIT) {
      return 3;
    }
    if (local_44 == SHADER_TYPE_RAY_INTERSECTION) {
      return 4;
    }
  }
  else {
    if (local_44 == SHADER_TYPE_CALLABLE) {
      return 5;
    }
    if (local_44 == SHADER_TYPE_LAST) {
      return 0;
    }
  }
  FormatString<char[25],Diligent::SHADER_TYPE,char[2]>
            (&local_40,(Diligent *)"Unexpected shader type (",(char (*) [25])&local_44,
             (SHADER_TYPE *)0x930f15,(char (*) [2])in_R8);
  DebugAssertionFailed
            (local_40._M_dataplus._M_p,"GetShaderTypePipelineIndex",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
             ,0x8bd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return -1;
}

Assistant:

Int32 GetShaderTypePipelineIndex(SHADER_TYPE ShaderType, PIPELINE_TYPE PipelineType)
{
    VERIFY(IsConsistentShaderType(ShaderType, PipelineType), "Shader type ", GetShaderTypeLiteralName(ShaderType),
           " is inconsistent with pipeline type ", GetPipelineTypeString(PipelineType));
    VERIFY(ShaderType == SHADER_TYPE_UNKNOWN || IsPowerOfTwo(ShaderType), "More than one shader type is specified");

    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    switch (ShaderType)
    {
        case SHADER_TYPE_UNKNOWN:
            return -1;

        case SHADER_TYPE_VERTEX:        // Graphics
        case SHADER_TYPE_AMPLIFICATION: // Mesh
        case SHADER_TYPE_COMPUTE:       // Compute
        case SHADER_TYPE_RAY_GEN:       // Ray tracing
        case SHADER_TYPE_TILE:          // Tile
            return 0;

        case SHADER_TYPE_HULL:     // Graphics
        case SHADER_TYPE_MESH:     // Mesh
        case SHADER_TYPE_RAY_MISS: // RayTracing
            return 1;

        case SHADER_TYPE_DOMAIN:          // Graphics
        case SHADER_TYPE_RAY_CLOSEST_HIT: // Ray tracing
            return 2;

        case SHADER_TYPE_GEOMETRY:    // Graphics
        case SHADER_TYPE_RAY_ANY_HIT: // Ray tracing
            return 3;

        case SHADER_TYPE_PIXEL:            // Graphics or Mesh
        case SHADER_TYPE_RAY_INTERSECTION: // Ray tracing
            return 4;

        case SHADER_TYPE_CALLABLE: // RayTracing
            return 5;

        default:
            UNEXPECTED("Unexpected shader type (", ShaderType, ")");
            return -1;
    }
}